

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

path * boost::filesystem::detail::canonical
                 (path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_type sVar3;
  path *ppVar4;
  size_type sVar5;
  bool bVar6;
  error_category *peVar7;
  path *ppVar8;
  filesystem_error *pfVar9;
  error_code ec_00;
  error_code ec_01;
  path result;
  path source;
  string local_110 [32];
  path *local_f0;
  size_type local_e8;
  error_code local_e0;
  iterator itr;
  int local_a0 [2];
  file_status stat;
  path link;
  path root;
  path new_source;
  
  bVar6 = path::has_root_directory(p);
  if (bVar6) {
    std::__cxx11::string::string((string *)&source,(string *)p);
  }
  else {
    absolute(&source,p,base);
  }
  path::root_path(&root,&source);
  result.m_pathname._M_dataplus._M_p = (pointer)&result.m_pathname.field_2;
  result.m_pathname._M_string_length = 0;
  result.m_pathname.field_2._M_local_buf[0] = '\0';
  local_e0.m_val = 0;
  local_e0.m_cat = system::system_category();
  status((detail *)&stat,&source,&local_e0);
  if (stat.m_value == file_not_found) {
    if (ec == (error_code *)0x0) {
      pfVar9 = (filesystem_error *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&itr,"boost::filesystem::canonical",(allocator<char> *)local_110);
      peVar7 = system::generic_category();
      ec_00.m_cat = peVar7;
      ec_00._0_8_ = 2;
      filesystem_error::filesystem_error(pfVar9,(string *)&itr,&source,ec_00);
      __cxa_throw(pfVar9,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    peVar7 = system::generic_category();
    ec->m_val = 2;
    ec->m_cat = peVar7;
  }
  else {
    if (local_e0.m_val == 0) {
      paVar1 = &(__return_storage_ptr__->m_pathname).field_2;
LAB_0010bcd9:
      result.m_pathname._M_string_length = 0;
      *result.m_pathname._M_dataplus._M_p = '\0';
      path::begin(&itr,&source);
      do {
        path::end(&source);
        sVar5 = itr.m_pos;
        ppVar4 = itr.m_path_ptr;
        sVar3 = local_e8;
        ppVar8 = local_f0;
        std::__cxx11::string::~string(local_110);
        if ((ppVar4 == ppVar8) && (sVar5 == sVar3)) {
          bVar2 = false;
          bVar6 = true;
          goto LAB_0010bde7;
        }
        ppVar8 = dot_path();
        bVar6 = operator==(&itr.m_element,ppVar8);
        if (!bVar6) {
          ppVar8 = dot_dot_path();
          bVar6 = operator==(&itr.m_element,ppVar8);
          if (bVar6) {
            bVar6 = operator!=(&result,&root);
            if (bVar6) {
              path::remove_filename(&result);
            }
          }
          else {
            path::operator/=(&result,&itr.m_element);
            symlink_status((detail *)local_a0,&result,ec);
            if ((ec != (error_code *)0x0) && (ec->m_val != 0)) {
              (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
              (__return_storage_ptr__->m_pathname)._M_string_length = 0;
              (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
              bVar6 = false;
              bVar2 = false;
              goto LAB_0010bde7;
            }
            if (local_a0[0] == 4) goto LAB_0010be0b;
          }
        }
        path::m_path_iterator_increment(&itr);
      } while( true );
    }
    if (ec == (error_code *)0x0) {
      pfVar9 = (filesystem_error *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&itr,"boost::filesystem::canonical",(allocator<char> *)local_110);
      ec_01._4_4_ = 0;
      ec_01.m_val = local_e0.m_val;
      ec_01.m_cat = local_e0.m_cat;
      filesystem_error::filesystem_error(pfVar9,(string *)&itr,&source,ec_01);
      __cxa_throw(pfVar9,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    *(ulong *)ec = CONCAT44(local_e0._4_4_,local_e0.m_val);
    ec->m_cat = local_e0.m_cat;
  }
LAB_0010bfe4:
  path::path(__return_storage_ptr__,&result);
LAB_0010bff1:
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::~string((string *)&source);
  return __return_storage_ptr__;
LAB_0010be0b:
  read_symlink(&link,&result,ec);
  if ((ec == (error_code *)0x0) || (ec->m_val == 0)) {
    path::remove_filename(&result);
    bVar6 = path::has_root_directory(&link);
    if (bVar6) {
      path::m_path_iterator_increment(&itr);
      while( true ) {
        path::end(&source);
        sVar5 = itr.m_pos;
        ppVar4 = itr.m_path_ptr;
        sVar3 = local_e8;
        ppVar8 = local_f0;
        std::__cxx11::string::~string(local_110);
        if ((ppVar4 == ppVar8) && (sVar5 == sVar3)) break;
        path::operator/=(&link,&itr.m_element);
        path::m_path_iterator_increment(&itr);
      }
      bVar6 = true;
      std::__cxx11::string::_M_assign((string *)&source);
    }
    else {
      std::__cxx11::string::string((string *)&new_source,(string *)&result);
      path::operator/=(&new_source,&link);
      path::m_path_iterator_increment(&itr);
      while( true ) {
        path::end(&source);
        sVar5 = itr.m_pos;
        ppVar4 = itr.m_path_ptr;
        sVar3 = local_e8;
        ppVar8 = local_f0;
        std::__cxx11::string::~string(local_110);
        if ((ppVar4 == ppVar8) && (sVar5 == sVar3)) break;
        path::operator/=(&new_source,&itr.m_element);
        path::m_path_iterator_increment(&itr);
      }
      std::__cxx11::string::_M_assign((string *)&source);
      std::__cxx11::string::~string((string *)&new_source);
      bVar6 = true;
    }
  }
  else {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    bVar6 = false;
  }
  std::__cxx11::string::~string((string *)&link);
  bVar2 = bVar6;
LAB_0010bde7:
  std::__cxx11::string::~string((string *)&itr);
  if (!bVar6) goto LAB_0010bff1;
  if (!bVar2) goto LAB_0010bfbf;
  goto LAB_0010bcd9;
LAB_0010bfbf:
  if (ec != (error_code *)0x0) {
    system::error_code::clear(ec);
  }
  bVar6 = path::has_root_directory(&result);
  if (!bVar6) {
    __assert_fail("(result.is_absolute())&&(\"canonical() implementation error; please report\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x368,
                  "path boost::filesystem::detail::canonical(const path &, const path &, system::error_code *)"
                 );
  }
  goto LAB_0010bfe4;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path canonical(const path& p, const path& base, system::error_code* ec)
  {
    path source (p.is_absolute() ? p : absolute(p, base));
    path root(source.root_path());
    path result;

    system::error_code local_ec;
    file_status stat (status(source, local_ec));

    if (stat.type() == fs::file_not_found)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source,
          error_code(system::errc::no_such_file_or_directory, system::generic_category())));
      ec->assign(system::errc::no_such_file_or_directory, system::generic_category());
      return result;
    }
    else if (local_ec)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source, local_ec));
      *ec = local_ec;
      return result;
    }

    bool scan (true);
    while (scan)
    {
      scan = false;
      result.clear();
      for (path::iterator itr = source.begin(); itr != source.end(); ++itr)
      {
        if (*itr == dot_path())
          continue;
        if (*itr == dot_dot_path())
        {
          if (result != root)
            result.remove_filename();
          continue;
        }

        result /= *itr;

        bool is_sym (is_symlink(detail::symlink_status(result, ec)));
        if (ec && *ec)
          return path();

        if (is_sym)
        {
          path link(detail::read_symlink(result, ec));
          if (ec && *ec)
            return path();
          result.remove_filename();

          if (link.is_absolute())
          {
            for (++itr; itr != source.end(); ++itr)
              link /= *itr;
            source = link;
          }
          else // link is relative
          {
            path new_source(result);
            new_source /= link;
            for (++itr; itr != source.end(); ++itr)
              new_source /= *itr;
            source = new_source;
          }
          scan = true;  // symlink causes scan to be restarted
          break;
        }
      }
    }
    if (ec != 0)
      ec->clear();
    BOOST_ASSERT_MSG(result.is_absolute(), "canonical() implementation error; please report");
    return result;
  }